

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

char gear_to_label(player *p,object *obj)

{
  wchar_t wVar1;
  ulong uVar2;
  object **ppoVar3;
  ulong uVar4;
  
  uVar2 = (ulong)(p->body).count;
  ppoVar3 = &((p->body).slots)->obj;
  uVar4 = 0;
  do {
    if (uVar2 == uVar4) {
LAB_00177ce8:
      for (uVar2 = 0; z_info->quiver_size != uVar2; uVar2 = uVar2 + 1) {
        if (p->upkeep->quiver[uVar2] == obj) {
          return (char)uVar2 + '0';
        }
      }
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        if (z_info->pack_size == uVar4) {
          return '\0';
        }
        uVar2 = uVar4 + 1;
      } while (p->upkeep->inven[uVar4] != obj);
      return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4];
    }
    if (*ppoVar3 == obj) {
      if (uVar4 < uVar2) {
        wVar1 = equipped_item_slot(p->body,obj);
        return "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[wVar1];
      }
      goto LAB_00177ce8;
    }
    uVar4 = uVar4 + 1;
    ppoVar3 = ppoVar3 + 4;
  } while( true );
}

Assistant:

char gear_to_label(struct player *p, struct object *obj)
{
	/* Skip rogue-like cardinal direction movement keys. */
	const char labels[] =
		 "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
	int i;

	/* Equipment is easy */
	if (object_is_equipped(p->body, obj)) {
		return labels[equipped_item_slot(p->body, obj)];
	}

	/* Check the quiver */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i] == obj) {
			return I2D(i);
		}
	}

	/* Check the inventory */
	for (i = 0; i < z_info->pack_size; i++) {
		if (p->upkeep->inven[i] == obj) {
			return labels[i];
		}
	}

	return '\0';
}